

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ecb.c
# Opt level: O0

err_t beltECBDecr(void *dest,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t src_00;
  octet *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  undefined1 *in_R8;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  
  if ((((void *)0xf < in_RDX) &&
      (((in_R8 == &DAT_00000010 || (in_R8 == (undefined1 *)0x18)) || (in_R8 == (undefined1 *)0x20)))
      ) && (((bVar1 = memIsValid(in_RSI,(size_t)in_RDX), bVar1 != 0 &&
             (bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0)) &&
            (bVar1 = memIsValid(in_RDI,(size_t)in_RDX), bVar1 != 0)))) {
    beltECB_keep();
    src_00 = blobCreate(in_stack_ffffffffffffffc8);
    if (src_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltECBStart(in_RDX,in_RCX,(size_t)in_R8);
    memMove(in_R8,src_00,0x143b3c);
    beltECBStepD(in_RDX,(size_t)in_RCX,in_R8);
    blobClose((blob_t)0x143b58);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltECBDecr(void* dest, const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (count < 16 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltECB_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// расшифровать
	beltECBStart(state, key, len);
	memMove(dest, src, count);
	beltECBStepD(dest, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}